

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

PropertyString * __thiscall
Js::ScriptContext::AddPropertyString2(ScriptContext *this,PropertyRecord *propString)

{
  Type *addr;
  ushort uVar1;
  JavascriptLibrary *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  PropertyString *pPVar5;
  uint i;
  uint uVar6;
  
  i = *(ushort *)
       &propString[1].super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject - 0x30;
  if (0x4a < (ushort)i) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptLibrary.h"
                                ,0x3d,"(ch >= \'0\' && ch <= \'z\')","ch >= \'0\' && ch <= \'z\'");
    if (!bVar3) goto LAB_007890ab;
    *puVar4 = 0;
  }
  if ((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings[i].ptr ==
      (PropertyStringMap *)0x0) {
    InitPropertyStringMap(this,i);
  }
  uVar1 = *(ushort *)
           ((long)&propString[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject + 2);
  if (0x4a < (ushort)(uVar1 - 0x30)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptLibrary.h"
                                ,0x3d,"(ch >= \'0\' && ch <= \'z\')","ch >= \'0\' && ch <= \'z\'");
    if (!bVar3) {
LAB_007890ab:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar6 = uVar1 - 0x30;
  this_00 = (this->super_ScriptContextBase).javascriptLibrary;
  pPVar5 = ((this_00->cache).propertyStrings[i].ptr)->strLen2[uVar6].ptr;
  if (pPVar5 == (PropertyString *)0x0) {
    if ((this->super_ScriptContextBase).isClosed == false) {
      pPVar5 = JavascriptLibrary::CreatePropertyString(this_00,propString);
      addr = ((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings[i].ptr)->
             strLen2 + uVar6;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pPVar5;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      TrackPid(this,propString);
      pPVar5 = ((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings[i].ptr)
               ->strLen2[uVar6].ptr;
    }
    else {
      pPVar5 = (PropertyString *)0x0;
    }
  }
  return pPVar5;
}

Assistant:

PropertyString* ScriptContext::AddPropertyString2(const Js::PropertyRecord* propString)
    {
        const char16* buf = propString->GetBuffer();
        const uint i = PropertyStringMap::PStrMapIndex(buf[0]);
        if (this->Cache()->propertyStrings[i] == NULL)
        {
            InitPropertyStringMap(i);
        }
        const uint j = PropertyStringMap::PStrMapIndex(buf[1]);
        if (this->Cache()->propertyStrings[i]->strLen2[j] == NULL && !isClosed)
        {
            this->Cache()->propertyStrings[i]->strLen2[j] = GetLibrary()->CreatePropertyString(propString);
            this->TrackPid(propString);
        }
        return this->Cache()->propertyStrings[i]->strLen2[j];
    }